

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O0

void Imf_3_2::Xdr::write<Imf_3_2::StreamIO,Imf_3_2::OStream>(OStream *out,double v)

{
  OStream *in_XMM0_Qa;
  uchar b [8];
  anon_union_8_2_94730066 u;
  uchar *in_stack_ffffffffffffffd8;
  
  writeUnsignedChars<Imf_3_2::StreamIO,Imf_3_2::OStream>(in_XMM0_Qa,in_stack_ffffffffffffffd8,0);
  return;
}

Assistant:

void
write (T& out, double v)
{
    union
    {
        uint64_t i;
        double   d;
    } u;
    u.d = v;

    unsigned char b[8];

    b[0] = (unsigned char) (u.i);
    b[1] = (unsigned char) (u.i >> 8);
    b[2] = (unsigned char) (u.i >> 16);
    b[3] = (unsigned char) (u.i >> 24);
    b[4] = (unsigned char) (u.i >> 32);
    b[5] = (unsigned char) (u.i >> 40);
    b[6] = (unsigned char) (u.i >> 48);
    b[7] = (unsigned char) (u.i >> 56);

    writeUnsignedChars<S> (out, b, 8);
}